

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O1

void * __thiscall duckdb_re2::Prog::PrefixAccel(Prog *this,void *data,size_t size)

{
  int __c;
  int iVar1;
  uint64_t *puVar2;
  ulong uVar3;
  long lVar4;
  size_t __n;
  void *pvVar5;
  uint64_t *puVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  if (this->prefix_foldcase_ != true) {
    if (this->prefix_size_ == 1) {
      pvVar5 = memchr(data,(this->field_11).prefix_front_back.prefix_front_,size);
      return pvVar5;
    }
    uVar3 = this->prefix_size_;
    if (size < uVar3) {
      pvVar5 = (void *)0x0;
    }
    else {
      __c = (this->field_11).prefix_front_back.prefix_front_;
      __n = (size - uVar3) + 1;
      pvVar5 = memchr(data,__c,__n);
      if (pvVar5 != (void *)0x0) {
        iVar1 = (this->field_11).prefix_front_back.prefix_back_;
        do {
          if (iVar1 == *(char *)((long)pvVar5 + (uVar3 - 1))) {
            return pvVar5;
          }
          pvVar5 = memchr((void *)((long)pvVar5 + 1),__c,(long)data + (__n - ((long)pvVar5 + 1)));
        } while (pvVar5 != (void *)0x0);
      }
    }
    return pvVar5;
  }
  uVar3 = this->prefix_size_;
  if (size < uVar3) {
    return (void *)0x0;
  }
  if (size < 8) {
    uVar12 = 0;
  }
  else {
    puVar2 = (this->field_11).prefix_dfa_;
    puVar6 = puVar2;
    uVar9 = 0;
    pbVar10 = (byte *)data;
    do {
      uVar17 = puVar2[*pbVar10] >> ((byte)uVar9 & 0x3f);
      uVar19 = puVar2[pbVar10[1]] >> ((byte)uVar17 & 0x3f);
      uVar18 = puVar2[pbVar10[2]] >> ((byte)uVar19 & 0x3f);
      uVar14 = puVar2[pbVar10[3]] >> ((byte)uVar18 & 0x3f);
      uVar16 = puVar2[pbVar10[4]] >> ((byte)uVar14 & 0x3f);
      uVar15 = puVar2[pbVar10[5]] >> ((byte)uVar16 & 0x3f);
      uVar11 = puVar2[pbVar10[6]] >> ((byte)uVar15 & 0x3f);
      uVar12 = puVar2[pbVar10[7]] >> ((byte)uVar11 & 0x3f);
      uVar8 = (uint)uVar12 & 0x3f;
      if (uVar8 == 0x36) {
        uVar12 = uVar9;
        if ((0x36U - (int)uVar17 & 0x3f) == 0) {
          pbVar7 = pbVar10 + 1;
        }
        else if ((0x36U - (int)uVar19 & 0x3f) == 0) {
          pbVar7 = pbVar10 + 2;
        }
        else if ((0x36U - (int)uVar18 & 0x3f) == 0) {
          pbVar7 = pbVar10 + 3;
        }
        else if ((0x36U - (int)uVar14 & 0x3f) == 0) {
          pbVar7 = pbVar10 + 4;
        }
        else if ((0x36U - (int)uVar16 & 0x3f) == 0) {
          pbVar7 = pbVar10 + 5;
        }
        else if ((0x36U - (int)uVar15 & 0x3f) == 0) {
          pbVar7 = pbVar10 + 6;
        }
        else {
          if ((0x36U - (int)uVar11 & 0x3f) != 0) {
            puVar6 = (uint64_t *)(pbVar10 + -uVar3 + 8);
            goto LAB_011fd1b2;
          }
          pbVar7 = pbVar10 + 7;
        }
        puVar6 = (uint64_t *)(pbVar7 + -uVar3);
      }
      else {
        pbVar10 = pbVar10 + 8;
      }
LAB_011fd1b2:
      if (uVar8 == 0x36) goto LAB_011fd1db;
      uVar9 = uVar12;
    } while (pbVar10 != (byte *)((size & 0xfffffffffffffff8) + (long)data));
    size = (size_t)((uint)size & 7);
    data = pbVar10;
LAB_011fd1db:
    if (uVar8 == 0x36) {
      return puVar6;
    }
  }
  sVar13 = 0;
  do {
    if (size == sVar13) {
      return (void *)0x0;
    }
    uVar12 = (this->field_11).prefix_dfa_[*(byte *)((long)data + sVar13)] >> ((byte)uVar12 & 0x3f);
    lVar4 = sVar13 + (1 - uVar3);
    sVar13 = sVar13 + 1;
  } while (((uint)uVar12 & 0x3f) != 0x36);
  return (byte *)((long)data + lVar4);
}

Assistant:

const void* PrefixAccel(const void* data, size_t size) {
    DCHECK(can_prefix_accel());
    if (prefix_foldcase_) {
      return PrefixAccel_ShiftDFA(data, size);
    } else if (prefix_size_ != 1) {
      return PrefixAccel_FrontAndBack(data, size);
    } else {
      return memchr(data, prefix_front_back.prefix_front_, size);
    }
  }